

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathBezierQuadraticCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,int num_segments)

{
  ImVector<ImVec2> *path;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 *__src;
  ImVec2 IVar3;
  int iVar4;
  ImVec2 *__dest;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  float x1;
  float y1;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar8 = (ulong)(this->_Path).Size;
  if ((long)uVar8 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.h"
                  ,0x666,"T &ImVector<ImVec2>::back() [T = ImVec2]");
  }
  path = &this->_Path;
  IVar1 = (this->_Path).Data[uVar8 - 1];
  x1 = IVar1.x;
  y1 = IVar1.y;
  if (num_segments != 0) {
    if (0 < num_segments) {
      iVar9 = 1;
      do {
        IVar1 = *p2;
        IVar2 = *p3;
        iVar5 = (int)uVar8;
        if (iVar5 == (this->_Path).Capacity) {
          if (iVar5 == 0) {
            iVar4 = 8;
          }
          else {
            iVar4 = ((int)(((uint)(uVar8 >> 0x1f) & 1) + iVar5) >> 1) + iVar5;
          }
          iVar6 = iVar5 + 1;
          if (iVar5 + 1 < iVar4) {
            iVar6 = iVar4;
          }
          __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
          __src = (this->_Path).Data;
          if (__src != (ImVec2 *)0x0) {
            memcpy(__dest,__src,(long)(this->_Path).Size << 3);
            ImGui::MemFree((this->_Path).Data);
          }
          (this->_Path).Data = __dest;
          (this->_Path).Capacity = iVar6;
          iVar5 = (this->_Path).Size;
        }
        else {
          __dest = (this->_Path).Data;
        }
        fVar13 = (float)iVar9 * (1.0 / (float)num_segments);
        fVar11 = 1.0 - fVar13;
        fVar12 = (fVar11 + fVar11) * fVar13;
        IVar3.y = fVar13 * fVar13 * IVar2.y + fVar11 * fVar11 * y1 + fVar12 * IVar1.y;
        IVar3.x = fVar13 * fVar13 * IVar2.x + fVar11 * fVar11 * x1 + fVar12 * IVar1.x;
        __dest[iVar5] = IVar3;
        uVar7 = path->Size + 1;
        uVar8 = (ulong)uVar7;
        path->Size = uVar7;
        bVar10 = iVar9 != num_segments;
        iVar9 = iVar9 + 1;
      } while (bVar10);
    }
    return;
  }
  PathBezierQuadraticCurveToCasteljau
            (path,x1,y1,p2->x,p2->y,p3->x,p3->y,this->_Data->CurveTessellationTol,0);
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}